

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.h
# Opt level: O1

Break * __thiscall CFG::RelooperBuilder::makeShapeContinue(RelooperBuilder *this,int id)

{
  Break *this_00;
  string_view sVar1;
  
  sVar1 = (string_view)getShapeContinueName(this,id);
  this_00 = (Break *)MixedArena::allocSpace(&((this->super_Builder).wasm)->allocator,0x30,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
  (this_00->name).super_IString.str._M_len = 0;
  (this_00->name).super_IString.str._M_str = (char *)0x0;
  this_00->value = (Expression *)0x0;
  this_00->condition = (Expression *)0x0;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
  (this_00->name).super_IString.str = sVar1;
  this_00->value = (Expression *)0x0;
  this_00->condition = (Expression *)0x0;
  ::wasm::Break::finalize(this_00);
  return this_00;
}

Assistant:

wasm::Break* makeShapeContinue(int id) {
    return wasm::Builder::makeBreak(getShapeContinueName(id));
  }